

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeFirst(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  uint uVar1;
  Fts5Expr *in_RSI;
  Fts5ExprNode *unaff_retaddr;
  Fts5Expr *in_stack_00000008;
  Fts5ExprNode *pChild;
  int nEof;
  int i;
  int rc;
  uint in_stack_ffffffffffffffd4;
  Fts5Config *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  *(undefined4 *)((long)&in_RSI->pIndex + 4) = 0;
  *(undefined4 *)&in_RSI->pConfig = 0;
  if ((*(int *)&in_RSI->pIndex == 4) || (*(int *)&in_RSI->pIndex == 9)) {
    iVar3 = fts5ExprNearInitAll(in_stack_00000008,unaff_retaddr);
  }
  else if (in_RSI->pRoot == (Fts5ExprNode *)0x0) {
    *(undefined4 *)((long)&in_RSI->pIndex + 4) = 1;
  }
  else {
    in_stack_ffffffffffffffe4 = 0;
    iVar2 = 0;
    while( true ) {
      uVar1 = in_stack_ffffffffffffffd4 & 0xffffff;
      if (iVar2 < *(int *)&in_RSI[1].pIndex) {
        uVar1 = CONCAT13(iVar3 == 0,(int3)in_stack_ffffffffffffffd4);
      }
      in_stack_ffffffffffffffd4 = uVar1;
      if ((char)(in_stack_ffffffffffffffd4 >> 0x18) == '\0') break;
      in_stack_ffffffffffffffd8 = (&in_RSI[1].pConfig)[iVar2];
      iVar3 = fts5ExprNodeFirst(in_RSI,(Fts5ExprNode *)CONCAT44(iVar3,iVar2));
      in_stack_ffffffffffffffe4 =
           *(int *)((long)&in_stack_ffffffffffffffd8->db + 4) + in_stack_ffffffffffffffe4;
      iVar2 = iVar2 + 1;
    }
    *(char **)&in_RSI->bDesc = (in_RSI[1].pConfig)->zName;
    if (*(int *)&in_RSI->pIndex == 1) {
      if (*(int *)&in_RSI[1].pIndex == in_stack_ffffffffffffffe4) {
        fts5ExprSetEof((Fts5ExprNode *)CONCAT44(in_stack_ffffffffffffffd4,1));
      }
    }
    else if (*(int *)&in_RSI->pIndex == 2) {
      if (0 < in_stack_ffffffffffffffe4) {
        fts5ExprSetEof((Fts5ExprNode *)CONCAT44(in_stack_ffffffffffffffd4,2));
      }
    }
    else {
      *(undefined4 *)((long)&in_RSI->pIndex + 4) =
           *(undefined4 *)((long)&(in_RSI[1].pConfig)->db + 4);
    }
  }
  if (iVar3 == 0) {
    iVar3 = fts5ExprNodeTest((Fts5Expr *)
                             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                             (Fts5ExprNode *)in_stack_ffffffffffffffd8);
  }
  return iVar3;
}

Assistant:

static int fts5ExprNodeFirst(Fts5Expr *pExpr, Fts5ExprNode *pNode){
  int rc = SQLITE_OK;
  pNode->bEof = 0;
  pNode->bNomatch = 0;

  if( Fts5NodeIsString(pNode) ){
    /* Initialize all term iterators in the NEAR object. */
    rc = fts5ExprNearInitAll(pExpr, pNode);
  }else if( pNode->xNext==0 ){
    pNode->bEof = 1;
  }else{
    int i;
    int nEof = 0;
    for(i=0; i<pNode->nChild && rc==SQLITE_OK; i++){
      Fts5ExprNode *pChild = pNode->apChild[i];
      rc = fts5ExprNodeFirst(pExpr, pNode->apChild[i]);
      assert( pChild->bEof==0 || pChild->bEof==1 );
      nEof += pChild->bEof;
    }
    pNode->iRowid = pNode->apChild[0]->iRowid;

    switch( pNode->eType ){
      case FTS5_AND:
        if( nEof>0 ) fts5ExprSetEof(pNode);
        break;

      case FTS5_OR:
        if( pNode->nChild==nEof ) fts5ExprSetEof(pNode);
        break;

      default:
        assert( pNode->eType==FTS5_NOT );
        pNode->bEof = pNode->apChild[0]->bEof;
        break;
    }
  }

  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest(pExpr, pNode);
  }
  return rc;
}